

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::exception_message(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *this,token_type expected,string *context)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  long lVar3;
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  string local_148 [32];
  undefined1 local_128 [40];
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [54];
  allocator local_2a;
  undefined1 local_29;
  string *context_local;
  long lStack_18;
  token_type expected_local;
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  string *error_msg;
  
  lVar3 = CONCAT44(in_register_00000034,expected);
  context_local._4_4_ = (token_type)context;
  local_29 = 0;
  lStack_18 = lVar3;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"syntax error ",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+((char *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "while parsing ");
    std::operator+(local_60,(char *)local_80);
    std::__cxx11::string::operator+=((string *)this,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string(local_80);
  }
  std::__cxx11::string::operator+=((string *)this,"- ");
  if (*(int *)(lVar3 + 0x20) == 0xe) {
    pcVar2 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::get_error_message((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)(lVar3 + 0x28));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar2,(allocator *)(local_128 + 0x27));
    std::operator+(local_e0,(char *)local_100);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_128);
    std::operator+(local_c0,local_e0);
    std::operator+(local_a0,(char *)local_c0);
    std::__cxx11::string::operator+=((string *)this,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)(local_128 + 0x27));
  }
  else {
    pcVar2 = lexer_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::token_type_name(*(token_type *)(lVar3 + 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,pcVar2,&local_169);
    std::operator+((char *)local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "unexpected ");
    std::__cxx11::string::operator+=((string *)this,local_148);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  if (context_local._4_4_ != uninitialized) {
    pcVar2 = lexer_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::token_type_name(context_local._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,pcVar2,&local_1b1);
    std::operator+((char *)local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "; expected ");
    std::__cxx11::string::operator+=((string *)this,local_190);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  return this;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
    {
        std::string error_msg = "syntax error ";

        if (!context.empty())
        {
            error_msg += "while parsing " + context + " ";
        }

        error_msg += "- ";

        if (last_token == token_type::parse_error)
        {
            error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
                         m_lexer.get_token_string() + "'";
        }
        else
        {
            error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
        }

        return error_msg;
    }